

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

float deqp::gles2::Performance::vectorFloatMedianAbsoluteDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  float fVar4;
  int local_48;
  int i;
  allocator<float> local_31;
  undefined1 local_30 [8];
  vector<float,_std::allocator<float>_> absoluteDeviations;
  float median;
  vector<long,_std::allocator<long>_> *v_local;
  
  absoluteDeviations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = vectorFloatMedian<long>(v);
  sVar1 = std::vector<long,_std::allocator<long>_>::size(v);
  std::allocator<float>::allocator(&local_31);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_30,sVar1,&local_31);
  std::allocator<float>::~allocator(&local_31);
  local_48 = 0;
  while( true ) {
    sVar1 = std::vector<long,_std::allocator<long>_>::size(v);
    if ((int)sVar1 <= local_48) break;
    pvVar2 = std::vector<long,_std::allocator<long>_>::operator[](v,(long)local_48);
    fVar4 = deFloatAbs((float)*pvVar2 -
                       absoluteDeviations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_30,(long)local_48);
    *pvVar3 = fVar4;
    local_48 = local_48 + 1;
  }
  fVar4 = vectorFloatMedian<float>((vector<float,_std::allocator<float>_> *)local_30);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return fVar4;
}

Assistant:

static float vectorFloatMedianAbsoluteDeviation (const vector<T>& v)
{
	float			median				= vectorFloatMedian(v);
	vector<float>	absoluteDeviations	(v.size());

	for (int i = 0; i < (int)v.size(); i++)
		absoluteDeviations[i] = deFloatAbs((float)v[i] - median);

	return vectorFloatMedian(absoluteDeviations);
}